

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_energy.cpp
# Opt level: O0

void Clash_detection_list
               (Structure *conf,vector<int,_std::allocator<int>_> *starts,
               vector<int,_std::allocator<int>_> *ends,vector<int,_std::allocator<int>_> *ResIdx,
               vector<int,_std::allocator<int>_> *ClashNum,vector<int,_std::allocator<int>_> *List)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  double dVar5;
  int n_starts;
  int List_size;
  double quot;
  double r;
  double dis;
  double disquare;
  int local_50;
  int clash_count;
  int t;
  int k;
  int l;
  int j;
  int p;
  int i;
  vector<int,_std::allocator<int>_> *List_local;
  vector<int,_std::allocator<int>_> *ClashNum_local;
  vector<int,_std::allocator<int>_> *ResIdx_local;
  vector<int,_std::allocator<int>_> *ends_local;
  vector<int,_std::allocator<int>_> *starts_local;
  Structure *conf_local;
  
  disquare._4_4_ = 0;
  _p = List;
  List_local = ClashNum;
  ClashNum_local = ResIdx;
  ResIdx_local = ends;
  ends_local = starts;
  starts_local = (vector<int,_std::allocator<int>_> *)conf;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(List);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(ends_local);
  for (local_50 = 0; local_50 < (int)sVar3; local_50 = local_50 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](ends_local,(long)local_50);
    for (t = *pvVar4; iVar1 = t,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](ResIdx_local,(long)local_50),
        iVar1 <= *pvVar4; t = t + 1) {
      if (((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish[(long)t * 0x54 + 2] != 0) &&
         ((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish[(long)t * 0x54 + 2] != 5)) {
        for (l = 0; l < (int)sVar2; l = l + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](_p,(long)l);
          iVar1 = *pvVar4;
          j = iVar1;
          if (iVar1 == t) {
            for (k = 6; k < (short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish[(long)t * 0x54 + 3];
                k = k + 1) {
              if (((*(int *)(*(long *)((starts_local->super__Vector_base<int,_std::allocator<int>_>)
                                       ._M_impl.super__Vector_impl_data._M_finish + (long)t * 0x54)
                             + (long)k * 0x50 + 0x18) != -0x3039) &&
                  (*(int *)(*(long *)((starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish + (long)t * 0x54) +
                            (long)k * 0x50 + 0x18) < 0x16)) &&
                 ((dVar5 = *(double *)
                            (*(long *)((starts_local->super__Vector_base<int,_std::allocator<int>_>)
                                       ._M_impl.super__Vector_impl_data._M_finish + (long)t * 0x54)
                            + (long)k * 0x50), dVar5 != 0.0 ||
                  ((((NAN(dVar5) ||
                     (dVar5 = *(double *)
                               (*(long *)((starts_local->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                (long)k * 0x50 + 8), dVar5 != 0.0)) || (NAN(dVar5))) ||
                   ((dVar5 = *(double *)
                              (*(long *)((starts_local->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_finish + (long)t * 0x54) +
                               (long)k * 0x50 + 0x10), dVar5 != 0.0 || (NAN(dVar5))))))))) {
                for (clash_count = 2; clash_count < 4; clash_count = clash_count + 1) {
                  if (((*(int *)(*(long *)((starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                 (long)clash_count * 0x50 + 0x18) != -0x3039) &&
                      (*(int *)(*(long *)((starts_local->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                (long)clash_count * 0x50 + 0x18) < 0x16)) &&
                     ((((dVar5 = *(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                  (long)clash_count * 0x50), dVar5 != 0.0 ||
                        (((NAN(dVar5) ||
                          (dVar5 = *(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)j * 0x54) + (long)clash_count * 0x50 + 8),
                          dVar5 != 0.0)) || (NAN(dVar5))))) ||
                       ((dVar5 = *(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                   (long)clash_count * 0x50 + 0x10), dVar5 != 0.0 || (NAN(dVar5)))))
                      && (dVar5 = (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 0x10) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 0x10)) *
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 0x10) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 0x10)) +
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                   (long)clash_count * 0x50)) *
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                   (long)clash_count * 0x50)) +
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 8) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 8)) *
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 8) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 8)), dVar5 <= 64.0)))) {
                    dVar5 = sqrt(dVar5);
                    if (((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish[(long)t * 0x54 + 2] == 1)
                       && ((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish[(long)j * 0x54 + 2] == 1
                          )) {
                      if (((((*(int *)(*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)t * 0x54) + (long)k * 0x50 + 0x18) != 0x10) ||
                            (*(int *)(*(long *)((starts_local->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_finish +
                                               (long)j * 0x54) + (long)clash_count * 0x50 + 0x18) !=
                             0x10)) || (dVar5 <= 1.8)) || (2.2 <= dVar5)) &&
                         (((((*(int *)(*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)t * 0x54) + (long)k * 0x50 + 0x18) != 0x10 ||
                             (*(int *)(*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                              != 4)) &&
                            ((*(int *)(*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)t * 0x54) + (long)k * 0x50 + 0x18) != 4 ||
                             (*(int *)(*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                              != 0x10)))) || ((dVar5 <= 2.7 || (3.3 <= dVar5)))) &&
                          (dVar5 = dVar5 / (Atom::radius
                                            [*(int *)(*(long *)((starts_local->
                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18)] +
                                           Atom::radius
                                           [*(int *)(*(long *)((starts_local->
                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                           ]), dVar5 <= 0.6)))) {
                        if ((0.6 < dVar5) || (dVar5 < 0.5)) {
                          disquare._4_4_ = disquare._4_4_ + 5;
                        }
                        else {
                          disquare._4_4_ = disquare._4_4_ + 1;
                        }
                      }
                    }
                    else {
                      dVar5 = dVar5 / (Atom::radius
                                       [*(int *)(*(long *)((starts_local->
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18)] +
                                      Atom::radius
                                      [*(int *)(*(long *)((starts_local->
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                      ]);
                      if (dVar5 <= 0.6) {
                        if ((0.6 < dVar5) || (dVar5 < 0.5)) {
                          disquare._4_4_ = disquare._4_4_ + 5;
                        }
                        else {
                          disquare._4_4_ = disquare._4_4_ + 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else if ((iVar1 <= t) ||
                  (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (ResIdx_local,(long)local_50), *pvVar4 < iVar1)) {
            iVar1 = j;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](ends_local,(long)local_50);
            if ((iVar1 < *pvVar4) || (t <= j)) {
              dVar5 = Point::dis((Point *)((starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish + (long)t * 0x54 + 0x40
                                          ),
                                 (Point *)((starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish + (long)j * 0x54 + 0x40
                                          ));
              if ((dVar5 < Residue::size
                           [(short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish[(long)t * 0x54 + 2]] +
                           Residue::size
                           [(short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish[(long)j * 0x54 + 2]] +
                           5.5) ||
                 (dVar5 = Point::dis((Point *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54 + 0x18),
                                     (Point *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)j * 0x54 + 0x40)),
                 dVar5 < Residue::bb_size +
                         Residue::size
                         [(short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish[(long)j * 0x54 + 2]] +
                         5.5)) {
                for (k = 6; k < (short)(starts_local->super__Vector_base<int,_std::allocator<int>_>)
                                       ._M_impl.super__Vector_impl_data._M_finish
                                       [(long)t * 0x54 + 3]; k = k + 1) {
                  if (((*(int *)(*(long *)((starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                 (long)k * 0x50 + 0x18) != -0x3039) &&
                      (*(int *)(*(long *)((starts_local->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                (long)k * 0x50 + 0x18) < 0x16)) &&
                     ((dVar5 = *(double *)
                                (*(long *)((starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                (long)k * 0x50), dVar5 != 0.0 ||
                      ((((NAN(dVar5) ||
                         (dVar5 = *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                    (long)k * 0x50 + 8), dVar5 != 0.0)) || (NAN(dVar5))) ||
                       ((dVar5 = *(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                   (long)k * 0x50 + 0x10), dVar5 != 0.0 || (NAN(dVar5))))))))) {
                    for (clash_count = 0;
                        clash_count <
                        (short)(starts_local->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                               .super__Vector_impl_data._M_finish[(long)j * 0x54 + 3];
                        clash_count = clash_count + 1) {
                      if ((((*(int *)(*(long *)((starts_local->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_finish +
                                               (long)j * 0x54) + (long)clash_count * 0x50 + 0x18) !=
                             -0x3039) &&
                           (*(int *)(*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)j * 0x54) + (long)clash_count * 0x50 + 0x18) <
                            0x16)) &&
                          (((dVar5 = *(double *)
                                      (*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)j * 0x54) + (long)clash_count * 0x50),
                            dVar5 != 0.0 ||
                            (((NAN(dVar5) ||
                              (dVar5 = *(double *)
                                        (*(long *)((starts_local->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 8),
                              dVar5 != 0.0)) || (NAN(dVar5))))) ||
                           ((dVar5 = *(double *)
                                      (*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)j * 0x54) + (long)clash_count * 0x50 + 0x10),
                            dVar5 != 0.0 || (NAN(dVar5))))))) &&
                         (dVar5 = (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 0x10) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 0x10)) *
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 0x10) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 0x10)) +
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                   (long)clash_count * 0x50)) *
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                   (long)clash_count * 0x50)) +
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 8) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 8)) *
                                  (*(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)t * 0x54) + (long)k * 0x50 + 8) -
                                  *(double *)
                                   (*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 8)), dVar5 <= 64.0)) {
                        dVar5 = sqrt(dVar5);
                        if (((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish[(long)t * 0x54 + 2] ==
                             1) && ((short)(starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish[(long)j * 0x54 + 2] ==
                                    1)) {
                          if (((((*(int *)(*(long *)((starts_local->
                                                     super__Vector_base<int,_std::allocator<int>_>).
                                                     _M_impl.super__Vector_impl_data._M_finish +
                                                    (long)t * 0x54) + (long)k * 0x50 + 0x18) != 0x10
                                 ) || (*(int *)(*(long *)((starts_local->
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                       != 0x10)) || (dVar5 <= 1.8)) || (2.2 <= dVar5)) &&
                             (((((*(int *)(*(long *)((starts_local->
                                                     super__Vector_base<int,_std::allocator<int>_>).
                                                     _M_impl.super__Vector_impl_data._M_finish +
                                                    (long)t * 0x54) + (long)k * 0x50 + 0x18) != 0x10
                                 || (*(int *)(*(long *)((starts_local->
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                     != 4)) &&
                                ((*(int *)(*(long *)((starts_local->
                                                     super__Vector_base<int,_std::allocator<int>_>).
                                                     _M_impl.super__Vector_impl_data._M_finish +
                                                    (long)t * 0x54) + (long)k * 0x50 + 0x18) != 4 ||
                                 (*(int *)(*(long *)((starts_local->
                                                     super__Vector_base<int,_std::allocator<int>_>).
                                                     _M_impl.super__Vector_impl_data._M_finish +
                                                    (long)j * 0x54) + (long)clash_count * 0x50 +
                                          0x18) != 0x10)))) || ((dVar5 <= 2.7 || (3.3 <= dVar5))))
                              && (dVar5 = dVar5 / (Atom::radius
                                                   [*(int *)(*(long *)((starts_local->
                                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18)] +
                                                  Atom::radius
                                                  [*(int *)(*(long *)((starts_local->
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                                  ]), dVar5 <= 0.6)))) {
                            if ((0.6 < dVar5) || (dVar5 < 0.5)) {
                              disquare._4_4_ = disquare._4_4_ + 5;
                            }
                            else {
                              disquare._4_4_ = disquare._4_4_ + 1;
                            }
                          }
                        }
                        else {
                          dVar5 = dVar5 / (Atom::radius
                                           [*(int *)(*(long *)((starts_local->
                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18)] +
                                          Atom::radius
                                          [*(int *)(*(long *)((starts_local->
                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                          ]);
                          if (dVar5 <= 0.6) {
                            if ((0.6 < dVar5) || (dVar5 < 0.5)) {
                              disquare._4_4_ = disquare._4_4_ + 5;
                            }
                            else {
                              disquare._4_4_ = disquare._4_4_ + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              for (k = 6; k < (short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish[(long)t * 0x54 + 3];
                  k = k + 1) {
                if (((*(int *)(*(long *)((starts_local->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_finish + (long)t * 0x54) +
                               (long)k * 0x50 + 0x18) != -0x3039) &&
                    (*(int *)(*(long *)((starts_local->super__Vector_base<int,_std::allocator<int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + (long)t * 0x54
                                       ) + (long)k * 0x50 + 0x18) < 0x16)) &&
                   ((dVar5 = *(double *)
                              (*(long *)((starts_local->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_finish + (long)t * 0x54) +
                              (long)k * 0x50), dVar5 != 0.0 ||
                    ((((NAN(dVar5) ||
                       (dVar5 = *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                  (long)k * 0x50 + 8), dVar5 != 0.0)) || (NAN(dVar5))) ||
                     ((dVar5 = *(double *)
                                (*(long *)((starts_local->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                 (long)k * 0x50 + 0x10), dVar5 != 0.0 || (NAN(dVar5))))))))) {
                  for (clash_count = 0;
                      clash_count <
                      (short)(starts_local->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish[(long)j * 0x54 + 3];
                      clash_count = clash_count + 1) {
                    if ((((*(int *)(*(long *)((starts_local->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                    (long)clash_count * 0x50 + 0x18) != -0x3039) &&
                         (*(int *)(*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                   (long)clash_count * 0x50 + 0x18) < 0x16)) &&
                        (((dVar5 = *(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)j * 0x54) + (long)clash_count * 0x50),
                          dVar5 != 0.0 ||
                          (((NAN(dVar5) ||
                            (dVar5 = *(double *)
                                      (*(long *)((starts_local->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish +
                                                (long)j * 0x54) + (long)clash_count * 0x50 + 8),
                            dVar5 != 0.0)) || (NAN(dVar5))))) ||
                         ((dVar5 = *(double *)
                                    (*(long *)((starts_local->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish +
                                              (long)j * 0x54) + (long)clash_count * 0x50 + 0x10),
                          dVar5 != 0.0 || (NAN(dVar5))))))) &&
                       (dVar5 = (*(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                   (long)k * 0x50 + 0x10) -
                                *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                  (long)clash_count * 0x50 + 0x10)) *
                                (*(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                   (long)k * 0x50 + 0x10) -
                                *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                  (long)clash_count * 0x50 + 0x10)) +
                                (*(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                  (long)k * 0x50) -
                                *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                 (long)clash_count * 0x50)) *
                                (*(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                  (long)k * 0x50) -
                                *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                 (long)clash_count * 0x50)) +
                                (*(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                   (long)k * 0x50 + 8) -
                                *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                  (long)clash_count * 0x50 + 8)) *
                                (*(double *)
                                  (*(long *)((starts_local->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish + (long)t * 0x54) +
                                   (long)k * 0x50 + 8) -
                                *(double *)
                                 (*(long *)((starts_local->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_finish + (long)j * 0x54) +
                                  (long)clash_count * 0x50 + 8)), dVar5 <= 64.0)) {
                      dVar5 = sqrt(dVar5);
                      if (((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish[(long)t * 0x54 + 2] == 1
                          ) && ((short)(starts_local->super__Vector_base<int,_std::allocator<int>_>)
                                       ._M_impl.super__Vector_impl_data._M_finish
                                       [(long)j * 0x54 + 2] == 1)) {
                        if ((((((*(int *)(*(long *)((starts_local->
                                                    super__Vector_base<int,_std::allocator<int>_>).
                                                    _M_impl.super__Vector_impl_data._M_finish +
                                                   (long)t * 0x54) + (long)k * 0x50 + 0x18) != 0x10)
                               || (*(int *)(*(long *)((starts_local->
                                                      super__Vector_base<int,_std::allocator<int>_>)
                                                      ._M_impl.super__Vector_impl_data._M_finish +
                                                     (long)j * 0x54) + (long)clash_count * 0x50 +
                                           0x18) != 0x10)) || (dVar5 <= 1.8)) || (2.2 <= dVar5)) &&
                            ((((*(int *)(*(long *)((starts_local->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18) != 0x10
                               || (*(int *)(*(long *)((starts_local->
                                                      super__Vector_base<int,_std::allocator<int>_>)
                                                      ._M_impl.super__Vector_impl_data._M_finish +
                                                     (long)j * 0x54) + (long)clash_count * 0x50 +
                                           0x18) != 4)) &&
                              ((*(int *)(*(long *)((starts_local->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18) != 4 ||
                               (*(int *)(*(long *)((starts_local->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                != 0x10)))) || ((dVar5 <= 2.7 || (3.3 <= dVar5)))))) &&
                           (dVar5 = dVar5 / (Atom::radius
                                             [*(int *)(*(long *)((starts_local->
                                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18)] +
                                            Atom::radius
                                            [*(int *)(*(long *)((starts_local->
                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                            ]), dVar5 <= 0.6)) {
                          if ((0.6 < dVar5) || (dVar5 < 0.5)) {
                            disquare._4_4_ = disquare._4_4_ + 5;
                          }
                          else {
                            disquare._4_4_ = disquare._4_4_ + 1;
                          }
                        }
                      }
                      else {
                        dVar5 = dVar5 / (Atom::radius
                                         [*(int *)(*(long *)((starts_local->
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)t * 0x54) + (long)k * 0x50 + 0x18)] +
                                        Atom::radius
                                        [*(int *)(*(long *)((starts_local->
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (long)j * 0x54) + (long)clash_count * 0x50 + 0x18)
                                        ]);
                        if (dVar5 <= 0.6) {
                          if ((0.6 < dVar5) || (dVar5 < 0.5)) {
                            disquare._4_4_ = disquare._4_4_ + 5;
                          }
                          else {
                            disquare._4_4_ = disquare._4_4_ + 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (disquare._4_4_ != 0) {
          std::vector<int,_std::allocator<int>_>::push_back(ClashNum_local,&t);
          std::vector<int,_std::allocator<int>_>::push_back
                    (List_local,(value_type *)((long)&disquare + 4));
        }
        disquare._4_4_ = 0;
      }
    }
  }
  return;
}

Assistant:

void Clash_detection_list(const Structure &conf, const vector<int> &starts, const vector<int> &ends, vector<int> &ResIdx,
                          vector<int> &ClashNum, const std::vector<int> &List) {
    int i, p, j, l, k, t, clash_count = 0;
    double disquare, dis, r, quot = 0;

    const int List_size = static_cast<int>(List.size());

    const int n_starts = static_cast<int>(starts.size());

    for (t = 0; t < n_starts; t++) {
        for (l = starts[t]; l <= ends[t]; l++) {
            if (conf._res[l]._type == 0 || conf._res[l]._type == 5)
                continue;
            for (p = 0; p < List_size; p++) {
                i = List[p];

                if (i == l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 2; k <= 3; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else if (i > l && i <= ends[t]) continue;
                else if (i >= starts[t] && i < l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 0; k < conf._res[i]._numAtom; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else {
                    if ((conf._res[l]._center.dis(conf._res[i]._center) <
                         Residue::size[conf._res[l]._type] + Residue::size[conf._res[i]._type] + CUB_SIZE) ||
                        (conf._res[l]._bbc.dis(conf._res[i]._center) <
                         Residue::bb_size + Residue::size[conf._res[i]._type] + CUB_SIZE)) {
                        for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                            // skip undefined and H atoms
                            if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                                continue;
                            if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                                conf._res[l]._atom[j].z == 0)
                                continue;
                            for (k = 0; k < conf._res[i]._numAtom; ++k) {
                                if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                                if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                    conf._res[i]._atom[k].z == 0)
                                    continue;

                                disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                           (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                           + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                             (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                           + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                             (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                                if (disquare <= PF_DIS_CUT_SQUARE) {
                                    dis = sqrt(disquare);
                                    r = Atom::radius[conf._res[l]._atom[j]._type] +
                                        Atom::radius[conf._res[i]._atom[k]._type];
                                    if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                        if ((conf._res[l]._atom[j]._type == 16) &&
                                            (conf._res[i]._atom[k]._type == 16) && (dis > 1.8 && dis < 2.2)) {
                                            continue;
                                        }
                                        else if (((conf._res[l]._atom[j]._type == 16 &&
                                                   conf._res[i]._atom[k]._type == 4) ||
                                                  (conf._res[l]._atom[j]._type == 4 &&
                                                   conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                            continue;
                                        }
                                        else {
                                            quot = dis / r;
                                            if (quot <= VDW_CLASH_CUTOFF) {
                                                if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                    clash_count++;
                                                else {
                                                    clash_count += 5;
                                                }
                                            }
                                        }
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
            if (clash_count != 0) {
                ResIdx.push_back(l);
                ClashNum.push_back(clash_count);
            }
            clash_count = 0;
        }
    }
}